

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O3

int __thiscall ON_Polyline::Clean(ON_Polyline *this,double tolerance)

{
  double *pdVar1;
  uint uVar2;
  ON_3dPoint *pOVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int i;
  long lVar8;
  long lVar9;
  int j;
  int iVar10;
  double dVar11;
  
  uVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  uVar4 = uVar2;
  if (2 < (int)uVar2) {
    iVar10 = 0;
    lVar8 = 1;
    lVar9 = 0x18;
    do {
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      dVar11 = ON_3dPoint::DistanceTo(pOVar3 + iVar10,(ON_3dPoint *)((long)&pOVar3->x + lVar9));
      if (tolerance < dVar11) {
        iVar10 = iVar10 + 1;
        lVar5 = (long)iVar10;
        if (lVar5 < lVar8) {
          pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
          pOVar3[lVar5].z = *(double *)((long)&pOVar3->z + lVar9);
          pdVar1 = (double *)((long)&pOVar3->x + lVar9);
          dVar11 = pdVar1[1];
          pOVar3[lVar5].x = *pdVar1;
          pOVar3[lVar5].y = dVar11;
        }
      }
      lVar8 = lVar8 + 1;
      iVar7 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
      uVar6 = (ulong)iVar7;
      lVar9 = lVar9 + 0x18;
    } while (lVar8 < (long)(uVar6 - 1));
    uVar4 = iVar10 + 2;
    if ((int)uVar4 < iVar7) {
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      iVar7 = (int)(uVar6 - 1);
      pOVar3[(long)iVar10 + 1].z = pOVar3[iVar7].z;
      dVar11 = pOVar3[iVar7].y;
      pOVar3[(long)iVar10 + 1].x = pOVar3[iVar7].x;
      pOVar3[(long)iVar10 + 1].y = dVar11;
      (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar4;
      uVar6 = (ulong)uVar4;
    }
    uVar4 = (uint)uVar6;
    if (2 < (int)uVar4) {
      do {
        pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        dVar11 = ON_3dPoint::DistanceTo
                           (pOVar3 + ((uVar6 & 0xffffffff) - 2),pOVar3 + ((uVar6 & 0xffffffff) - 1))
        ;
        uVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
        if (tolerance < dVar11) break;
        pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        pOVar3[(long)(int)uVar4 + -2].z = pOVar3[(long)(int)uVar4 + -1].z;
        dVar11 = pOVar3[(long)(int)uVar4 + -1].y;
        pOVar3[(long)(int)uVar4 + -2].x = pOVar3[(long)(int)uVar4 + -1].x;
        pOVar3[(long)(int)uVar4 + -2].y = dVar11;
        iVar10 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
        uVar4 = iVar10 - 1;
        uVar6 = (ulong)uVar4;
        (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar4;
      } while (3 < iVar10);
    }
  }
  return uVar2 - uVar4;
}

Assistant:

int ON_Polyline::Clean( double tolerance )
{
  // 14 January 2005 Dale Lear
  //     Fixed this cleaner so that it did not modify
  //     the start and end point.
  int count0 = m_count;

  if ( m_count > 2 )
  {
    int i,j;
    j = 0;
    for ( i = 1; i < m_count-1; i++ )
    {
       if ( m_a[j].DistanceTo(m_a[i]) <= tolerance )
         continue;
       j++;
       if ( i > j )
         m_a[j] = m_a[i];
    }

    if ( m_count > j+2 )
    {
      m_a[j+1] = m_a[m_count-1];
      m_count = j+2;
    }

    while ( m_count > 2 && m_a[m_count-2].DistanceTo(m_a[m_count-1]) <= tolerance )
    {
      m_a[m_count-2] = m_a[m_count-1];
      m_count--;
    }
  }

  return count0-m_count;
}